

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_compare_single_schema
                 (lyd_node *node1,lyd_node *node2,uint32_t options,ly_bool parental_schemas_checked)

{
  ly_bool lVar1;
  lys_module *plVar2;
  lysc_node *plVar3;
  lysc_node *plVar4;
  lys_module *plVar5;
  
  plVar3 = node1->schema;
  if (plVar3 == (lysc_node *)0x0) {
    plVar2 = (lys_module *)&node1[2].schema;
  }
  else {
    plVar2 = plVar3->module;
  }
  plVar4 = node2->schema;
  if (plVar4 == (lysc_node *)0x0) {
    plVar5 = (lys_module *)&node2[2].schema;
  }
  else {
    plVar5 = plVar4->module;
  }
  if (plVar2->ctx == plVar5->ctx) {
    if ((options & 4) == 0) {
      if (plVar3 != plVar4) {
        return LY_ENOT;
      }
    }
    else {
      plVar3 = lyd_node_schema(node1);
      plVar4 = lyd_node_schema(node2);
      if (plVar3 != plVar4) {
        return LY_ENOT;
      }
    }
  }
  else {
    lVar1 = lyd_compare_schema_equal(plVar3,plVar4);
    if (lVar1 == '\0') {
      return LY_ENOT;
    }
    if ((parental_schemas_checked == '\0') &&
       (lVar1 = lyd_compare_schema_parents_equal
                          ((lyd_node *)node1->schema,(lyd_node *)node2->schema), lVar1 == '\0')) {
      return LY_ENOT;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_compare_single_schema(const struct lyd_node *node1, const struct lyd_node *node2, uint32_t options,
        ly_bool parental_schemas_checked)
{
    if (LYD_CTX(node1) == LYD_CTX(node2)) {
        /* same contexts */
        if (options & LYD_COMPARE_OPAQ) {
            if (lyd_node_schema(node1) != lyd_node_schema(node2)) {
                return LY_ENOT;
            }
        } else {
            if (node1->schema != node2->schema) {
                return LY_ENOT;
            }
        }
    } else {
        /* different contexts */
        if (!lyd_compare_schema_equal(node1->schema, node2->schema)) {
            return LY_ENOT;
        }
        if (!parental_schemas_checked) {
            if (!lyd_compare_schema_parents_equal(node1, node2)) {
                return LY_ENOT;
            }
            parental_schemas_checked = 1;
        }
    }

    return LY_SUCCESS;
}